

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowConstantAggregatorLocalState::Sink
          (WindowConstantAggregatorLocalState *this,DataChunk *sink_chunk,DataChunk *coll_chunk,
          idx_t row,optional_ptr<duckdb::SelectionVector,_true> filter_sel,idx_t filtered)

{
  ulong *puVar1;
  WindowAggregator *pWVar2;
  sel_t *psVar3;
  aggregate_simple_update_t p_Var4;
  Vector *pVVar5;
  ulong *puVar6;
  DataChunk *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  DataChunk *this_01;
  ulong *puVar7;
  type pVVar8;
  reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  FunctionDataWrapper *pFVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  value_type vVar16;
  size_type __n;
  idx_t iVar17;
  size_type sVar18;
  ulong uVar19;
  ulong uVar20;
  idx_t iVar21;
  WindowConstantAggregatorLocalState *pWVar22;
  WindowConstantAggregatorGlobalState *pWVar23;
  SelectionVector sel;
  AggregateInputData aggr_input_data;
  optional_ptr<duckdb::SelectionVector,_true> local_f8;
  size_type local_f0;
  idx_t local_e8;
  ulong local_e0;
  WindowConstantAggregatorLocalState *local_d8;
  idx_t local_d0;
  DataChunk *local_c8;
  idx_t local_c0;
  ulong local_b8;
  WindowConstantAggregatorGlobalState *local_b0;
  SelectionVector local_a8;
  vector<unsigned_long,_true> *local_88;
  DataChunk *local_80;
  Vector *local_78;
  data_ptr_t local_70;
  ulong local_68;
  data_ptr_t local_60;
  value_type local_58;
  value_type local_50;
  AggregateInputData local_48;
  
  local_b0 = this->gstate;
  puVar1 = (local_b0->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
           .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = puVar1;
  uVar14 = (long)(local_b0->partition_offsets).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  while (puVar6 = puVar7, 0 < (long)uVar14) {
    uVar19 = uVar14 >> 1;
    puVar7 = puVar6 + uVar19 + 1;
    uVar14 = ~uVar19 + uVar14;
    if (row < puVar6[uVar19]) {
      puVar7 = puVar6;
      uVar14 = uVar19;
    }
  }
  local_b8 = sink_chunk->count + row;
  local_f0 = (long)puVar6 - (long)puVar1;
  local_f8.ptr = filter_sel.ptr;
  local_e0 = filtered;
  local_d0 = row;
  pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&(this->statef).statef);
  local_60 = pVVar8->data;
  local_70 = (this->statep).data;
  pWVar2 = (this->gstate->super_WindowAggregatorGlobalState).aggregator;
  local_d8 = this;
  if ((pWVar2->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pWVar2->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar18 = 0;
    do {
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&(this->payload_chunk).data,sVar18);
      pvVar10 = vector<unsigned_long,_true>::operator[](&pWVar2->child_idx,sVar18);
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&sink_chunk->data,*pvVar10);
      Vector::Reference(pvVar9,pvVar11);
      sVar18 = sVar18 + 1;
    } while (sVar18 < (ulong)((long)(pWVar2->child_idx).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pWVar2->child_idx).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  __n = (long)local_f0 >> 3;
  local_88 = &local_b0->partition_offsets;
  if ((local_b0->super_WindowAggregatorGlobalState).aggr.bind_data_wrapper.internal.
      super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_48.bind_data.ptr = (FunctionData *)0x0;
  }
  else {
    pFVar12 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                        (&(local_b0->super_WindowAggregatorGlobalState).aggr.bind_data_wrapper);
    local_48.bind_data.ptr =
         (pFVar12->function_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  uVar19 = local_b8;
  iVar17 = local_d0;
  pWVar22 = local_d8;
  uVar14 = local_e0;
  local_48.allocator =
       &(local_d8->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
  local_48.combine_type = PRESERVE_INPUT;
  local_f0 = __n;
  pvVar10 = vector<unsigned_long,_true>::operator[](local_88,__n);
  if (iVar17 < uVar19) {
    local_f0 = local_f0 - 1;
    local_78 = &pWVar22->statep;
    local_80 = &pWVar22->inputs;
    local_c8 = &pWVar22->payload_chunk;
    local_e8 = 0;
    uVar20 = 0;
    local_58 = local_d0;
    vVar16 = *pvVar10;
    do {
      if (local_58 == vVar16) {
        lVar15 = local_f0 + 1;
        pvVar10 = vector<unsigned_long,_true>::operator[](local_88,local_f0 + 2);
        vVar16 = *pvVar10;
        local_f0 = lVar15;
      }
      this_01 = local_80;
      local_50 = vVar16;
      if (uVar19 <= vVar16) {
        local_50 = uVar19;
      }
      iVar17 = local_50 - local_d0;
      DataChunk::Reset(local_80);
      other = local_c8;
      iVar21 = local_e8;
      local_c0 = iVar17;
      if (local_f8.ptr == (SelectionVector *)0x0) {
        local_68 = uVar20;
        if (local_e8 == 0) {
          DataChunk::Reference(this_01,local_c8);
          iVar21 = local_e8;
          iVar17 = local_c0;
        }
        else if ((pWVar22->payload_chunk).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish !=
                 (pWVar22->payload_chunk).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start) {
          sVar18 = 0;
          do {
            pvVar9 = vector<duckdb::Vector,_true>::operator[](&this_01->data,sVar18);
            pvVar11 = vector<duckdb::Vector,_true>::operator[](&local_c8->data,sVar18);
            Vector::Slice(pvVar9,pvVar11,iVar21,iVar17);
            sVar18 = sVar18 + 1;
          } while (sVar18 < (ulong)(((long)(pWVar22->payload_chunk).data.
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pWVar22->payload_chunk).data.
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0x4ec4ec4ec4ec4ec5));
        }
        iVar17 = iVar17 - iVar21;
        (pWVar22->inputs).count = iVar17;
        uVar14 = local_e0;
        uVar20 = local_68;
        pWVar23 = local_b0;
      }
      else {
        local_a8.sel_vector = (sel_t *)0x0;
        local_a8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_a8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uVar19 = uVar20;
        if (uVar20 < uVar14) {
          do {
            optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_f8);
            uVar13 = uVar20;
            if ((local_f8.ptr)->sel_vector != (sel_t *)0x0) {
              uVar13 = (ulong)(local_f8.ptr)->sel_vector[uVar20];
            }
            uVar19 = uVar20;
          } while ((uVar13 < iVar21) && (uVar20 = uVar20 + 1, uVar19 = uVar14, uVar14 != uVar20));
        }
        optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_f8);
        this_00._M_pi =
             local_a8.selection_data.internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        psVar3 = (local_f8.ptr)->sel_vector;
        local_a8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_a8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        iVar17 = uVar14 - uVar19;
        local_a8.sel_vector = psVar3 + uVar19;
        if (uVar14 < uVar19 || iVar17 == 0) {
          iVar17 = 0;
          uVar20 = uVar19;
        }
        else {
          iVar21 = 0;
          do {
            optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_f8);
            if ((local_f8.ptr)->sel_vector == (sel_t *)0x0) {
              uVar14 = uVar19 + iVar21;
            }
            else {
              uVar14 = (ulong)(local_f8.ptr)->sel_vector[uVar19 + iVar21];
            }
            if (local_c0 <= uVar14) {
              uVar20 = uVar19 + iVar21;
              iVar17 = iVar21;
              break;
            }
            iVar21 = iVar21 + 1;
            uVar20 = local_e0;
          } while (iVar17 != iVar21);
        }
        pWVar23 = local_b0;
        if (iVar17 != (local_d8->inputs).count) {
          DataChunk::Slice(local_80,other,&local_a8,iVar17,0);
        }
        uVar14 = local_e0;
        if (local_a8.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        iVar17 = (local_d8->inputs).count;
        pWVar22 = local_d8;
      }
      p_Var4 = (pWVar23->super_WindowAggregatorGlobalState).aggr.function.simple_update;
      if (p_Var4 == (aggregate_simple_update_t)0x0) {
        *(data_ptr_t *)local_70 = *(data_ptr_t *)(local_60 + local_f0 * 8);
        pVVar5 = (pWVar22->inputs).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (*(pWVar23->super_WindowAggregatorGlobalState).aggr.function.update)
                  (pVVar5,&local_48,
                   ((long)(pWVar22->inputs).data.
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 3) *
                   0x4ec4ec4ec4ec4ec5,local_78,iVar17);
      }
      else {
        pVVar5 = (pWVar22->inputs).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (*p_Var4)(pVVar5,&local_48,
                  ((long)(pWVar22->inputs).data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pVVar5 >> 3) *
                  0x4ec4ec4ec4ec4ec5,*(data_ptr_t *)(local_60 + local_f0 * 8),iVar17);
      }
      lVar15 = local_58 - local_e8;
      local_e8 = local_c0;
      local_58 = lVar15 + local_c0;
      vVar16 = local_50;
      uVar19 = local_b8;
    } while (local_58 < local_b8);
  }
  return;
}

Assistant:

void WindowConstantAggregatorLocalState::Sink(DataChunk &sink_chunk, DataChunk &coll_chunk, idx_t row,
                                              optional_ptr<SelectionVector> filter_sel, idx_t filtered) {
	auto &partition_offsets = gstate.partition_offsets;
	const auto &aggr = gstate.aggr;
	const auto chunk_begin = row;
	const auto chunk_end = chunk_begin + sink_chunk.size();
	idx_t partition =
	    idx_t(std::upper_bound(partition_offsets.begin(), partition_offsets.end(), row) - partition_offsets.begin()) -
	    1;

	auto state_f_data = statef.GetData();
	auto state_p_data = FlatVector::GetData<data_ptr_t>(statep);

	auto &child_idx = gstate.aggregator.child_idx;
	for (column_t c = 0; c < child_idx.size(); ++c) {
		payload_chunk.data[c].Reference(sink_chunk.data[child_idx[c]]);
	}

	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	idx_t begin = 0;
	idx_t filter_idx = 0;
	auto partition_end = partition_offsets[partition + 1];
	while (row < chunk_end) {
		if (row == partition_end) {
			++partition;
			partition_end = partition_offsets[partition + 1];
		}
		partition_end = MinValue(partition_end, chunk_end);
		auto end = partition_end - chunk_begin;

		inputs.Reset();
		if (filter_sel) {
			// 	Slice to any filtered rows in [begin, end)
			SelectionVector sel;

			//	Find the first value in [begin, end)
			for (; filter_idx < filtered; ++filter_idx) {
				auto idx = filter_sel->get_index(filter_idx);
				if (idx >= begin) {
					break;
				}
			}

			//	Find the first value in [end, filtered)
			sel.Initialize(filter_sel->data() + filter_idx);
			idx_t nsel = 0;
			for (; filter_idx < filtered; ++filter_idx, ++nsel) {
				auto idx = filter_sel->get_index(filter_idx);
				if (idx >= end) {
					break;
				}
			}

			if (nsel != inputs.size()) {
				inputs.Slice(payload_chunk, sel, nsel);
			}
		} else {
			//	Slice to [begin, end)
			if (begin) {
				for (idx_t c = 0; c < payload_chunk.ColumnCount(); ++c) {
					inputs.data[c].Slice(payload_chunk.data[c], begin, end);
				}
			} else {
				inputs.Reference(payload_chunk);
			}
			inputs.SetCardinality(end - begin);
		}

		//	Aggregate the filtered rows into a single state
		const auto count = inputs.size();
		auto state = state_f_data[partition];
		if (aggr.function.simple_update) {
			aggr.function.simple_update(inputs.data.data(), aggr_input_data, inputs.ColumnCount(), state, count);
		} else {
			state_p_data[0] = state_f_data[partition];
			aggr.function.update(inputs.data.data(), aggr_input_data, inputs.ColumnCount(), statep, count);
		}

		//	Skip filtered rows too!
		row += end - begin;
		begin = end;
	}
}